

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O3

void __thiscall
txpackage_tests::package_submission_tests::test_method(package_submission_tests *this)

{
  pointer *this_00;
  pointer *ppsVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar7;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  CKey input_signing_key_02;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined7 uVar17;
  int iVar18;
  unsigned_long uVar19;
  Chainstate *pCVar20;
  pointer pvVar21;
  iterator iVar22;
  iterator iVar23;
  const_iterator cVar24;
  const_iterator cVar25;
  int64_t iVar26;
  TestChain100Setup *pTVar27;
  long lVar28;
  iterator pvVar29;
  CTxMemPool *pCVar30;
  PackageMempoolAcceptResult *client_maxfeerate;
  iterator pvVar31;
  CMutableTransaction *pCVar32;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *client_maxfeerate_00;
  long in_FS_OFFSET;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef input_transaction_02;
  undefined4 uVar37;
  check_type cVar41;
  undefined8 uVar38;
  TestChain100Setup *pTVar39;
  CKey *other;
  CAmount in_stack_fffffffffffff598;
  undefined1 uVar40;
  undefined8 in_stack_fffffffffffff5a0;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined4 local_6f4;
  assertion_result local_6f0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  Package package_invalid_parent;
  CTransactionRef tx_parent_invalid;
  CScriptWitness bad_witness;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  CTransactionRef tx_grandchild;
  undefined1 local_5a0 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_598;
  element_type *local_590;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_588;
  undefined1 local_580 [8];
  secure_unique_ptr<KeyType> local_578;
  CTransactionRef tx_child;
  undefined1 local_560 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_558;
  element_type *local_550;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_548;
  undefined1 local_540 [8];
  secure_unique_ptr<KeyType> local_538;
  CTransactionRef tx_parent;
  undefined1 local_520 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_518;
  element_type *local_510;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_508;
  CMutableTransaction mtx_parent;
  Package package_3gen;
  Package package_parent_child;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 local_3f8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_3f0;
  undefined8 local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e0;
  Package package_unrelated;
  undefined1 local_3b8 [8];
  secure_unique_ptr<KeyType> local_3b0;
  uint expected_pool_size;
  char *local_3a0;
  undefined1 local_398 [8];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  undefined1 local_378 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  Package package_missing_parent;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_parent_invalid;
  CMutableTransaction mtx_parent_invalid;
  PackageMempoolAcceptResult result_3gen_submit;
  direct_or_indirect local_258;
  uint local_23c;
  direct_or_indirect local_238;
  uint local_21c;
  direct_or_indirect local_218;
  uint local_1fc;
  CMutableTransaction mtx_child;
  CMutableTransaction mtx_grandchild;
  direct_or_indirect local_178;
  uint local_15c;
  direct_or_indirect local_158;
  uint local_13c;
  PackageMempoolAcceptResult result_unrelated_submit;
  direct_or_indirect local_b8;
  uint local_9c;
  direct_or_indirect local_98;
  uint local_7c;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  shared_count asStack_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock16.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock16.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock16.super_unique_lock);
  uVar19 = CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                            super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                            m_node.mempool._M_t.
                            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
                            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  expected_pool_size = (uint)uVar19;
  GenerateRandomKey(SUB81((CKey *)local_3b8,0));
  CKey::GetPubKey((CPubKey *)&result_3gen_submit,(CKey *)local_3b8);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._8_12_ = mtx_grandchild._16_12_;
  PKHash::PKHash((PKHash *)&mtx_grandchild,(CPubKey *)&result_3gen_submit);
  result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length._0_4_ =
       mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_unrelated_submit.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination
            ((CScript *)&local_98.indirect_contents,(CTxDestination *)&result_unrelated_submit);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_unrelated_submit);
  package_unrelated.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_unrelated.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_unrelated.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  other = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey;
  lVar28 = 0;
  do {
    psVar6 = (((TestChain100Setup *)this)->m_coinbase_txns).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3e8 = *(undefined8 *)
                 ((long)&psVar6[0x19].
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 lVar28);
    local_3e0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&psVar6[0x19].
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + lVar28);
    if (local_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_3e0->_M_use_count = local_3e0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_3e0->_M_use_count = local_3e0->_M_use_count + 1;
      }
    }
    CKey::CKey((CKey *)local_3f8,other);
    uVar38 = 0x6898e4;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
    input_signing_key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )0x124101100;
    input_signing_key._0_8_ = &local_b8;
    auVar13._8_8_ = this;
    auVar13._0_8_ = uVar38;
    auVar13._16_8_ = other;
    auVar13._24_8_ = 0;
    input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3e8;
    TestChain100Setup::CreateValidMempoolTransaction
              ((CMutableTransaction *)&result_unrelated_submit,(TestChain100Setup *)this,
               input_transaction,0,(int)(CKey *)local_3f8,input_signing_key,
               (CScript)(auVar13 << 0x40),in_stack_fffffffffffff598,
               SUB81(in_stack_fffffffffffff5a0,0));
    if (0x1c < local_9c) {
      free(local_b8.indirect_contents.indirect);
      local_b8.indirect_contents.indirect = (char *)0x0;
    }
    if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_3f0._M_head_impl !=
        (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_3f0,
                 local_3f0._M_head_impl);
    }
    local_3f0._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
    if (local_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0);
    }
    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result =
         PCKG_RESULT_UNSET;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason,(CTransaction **)&result_3gen_submit,
               (allocator<CTransaction> *)&mtx_grandchild,
               (CMutableTransaction *)&result_unrelated_submit);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package_unrelated,(shared_ptr<const_CTransaction> *)&result_3gen_submit);
    if (result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
        _M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_reject_reason._M_dataplus._M_p);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               &result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason.field_2);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&result_unrelated_submit);
    uVar40 = (undefined1)in_stack_fffffffffffff5a0;
    lVar28 = lVar28 + 0x10;
  } while (lVar28 != 0xa0);
  pTVar39 = (TestChain100Setup *)this;
  pCVar20 = ChainstateManager::ActiveChainstate
                      ((((BOOST_AUTO_TEST_CASE_FIXTURE *)
                        &((TestChain100Setup *)this)->super_TestingSetup)->super_TestChain100Setup).
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate = &result_3gen_submit;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  pvVar29 = (iterator)0x0;
  ProcessNewPackage(&result_unrelated_submit,pCVar20,
                    (((BOOST_AUTO_TEST_CASE_FIXTURE *)
                     &((TestChain100Setup *)this)->super_TestingSetup)->super_TestChain100Setup).
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_unrelated,false
                    ,(optional<CFeeRate> *)client_maxfeerate);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar41 = 0x689a59;
  file.m_end = (iterator)0x175;
  file.m_begin = (iterator)&local_408;
  msg.m_end = (iterator)client_maxfeerate;
  msg.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_418,msg);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         result_unrelated_submit.m_state.
                         super_ValidationState<PackageValidationResult>.m_mode == M_INVALID);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._8_16_ = (undefined1  [16])0x0;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_parent;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19d6575;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf447d7;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01389048;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_420 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_grandchild,(lazy_ostream *)&result_3gen_submit,1,0,WARN,
             _cVar41,(size_t)&local_428,0x175);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x176;
  file_00.m_begin = (iterator)&local_438;
  msg_00.m_end = pvVar31;
  msg_00.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_448,
             msg_00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01388f08;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)local_78;
  local_78._0_4_ =
       result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.m_result;
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               result_unrelated_submit.m_state.
                               super_ValidationState<PackageValidationResult>.m_result ==
                               PCKG_POLICY);
  local_58 = (undefined1  [8])&local_178;
  local_178._0_4_ = 1;
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19c8ce0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf4389f;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&err_parent_invalid;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0138e0e0;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e0e0;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_child,(lazy_ostream *)&mtx_parent,1,2,REQUIRE,0xf447d8,
             (size_t)&mtx_parent_invalid,0x176,&result_3gen_submit,
             "PackageValidationResult::PCKG_POLICY",(int)&mtx_grandchild);
  this_00 = &mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)this_00);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x177;
  file_01.m_begin = (iterator)&local_458;
  msg_01.m_end = pvVar31;
  msg_01.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_468,
             msg_01);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01388f08;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)this_00;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&mtx_child,
             result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p,
             result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p +
             CONCAT44(result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>
                      .m_reject_reason._M_string_length._4_4_,
                      (undefined4)
                      result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>
                      .m_reject_reason._M_string_length));
  iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &mtx_child,"package-not-child-with-parents");
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,iVar18 == 0);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)anon_var_dwarf_19c8ce0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = (size_type)"";
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01388fc8;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_58;
  local_78 = (undefined1  [8])0xf44836;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e160;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_78;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  local_58 = (undefined1  [8])&mtx_child;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent_invalid,(lazy_ostream *)&mtx_parent,1,2,REQUIRE,
             0xf44804,(size_t)&err_parent_invalid,0x177,&result_3gen_submit,
             "\"package-not-child-with-parents\"",(int)&mtx_grandchild);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pTVar27 = pTVar39;
  if (mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)this_00) {
    operator_delete(mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->prevout).hash.
                            m_wrapped.super_base_blob<256U>.m_data._M_elems + 1));
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x178;
  file_02.m_begin = (iterator)&local_478;
  msg_02.m_end = pvVar31;
  msg_02.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_488,
             msg_02);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01388f08;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  local_78 = (undefined1  [8])
             CTxMemPool::size((pTVar39->super_TestingSetup).super_ChainTestingSetup.
                              super_BasicTestingSetup.m_node.mempool._M_t.
                              super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                              .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_58 = (undefined1  [8])&expected_pool_size;
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_78 == (undefined1  [8])(ulong)expected_pool_size);
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19c8ce0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf4389f;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)local_78;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01388f48;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&err_parent_invalid;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_child,(lazy_ostream *)&mtx_parent,1,2,REQUIRE,0xf44395,
             (size_t)&mtx_parent_invalid,0x178,&result_3gen_submit,"expected_pool_size",
             (int)&mtx_grandchild);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  package_parent_child.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_parent_child.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_parent_child.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_3gen.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_3gen.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_3gen.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar6 = (pTVar39->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_510 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_508 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_508 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_508->_M_use_count = local_508->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_508->_M_use_count = local_508->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_520,other);
  uVar38 = 0x68a01b;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_158.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_00._0_8_ = &local_158;
  auVar14._8_8_ = pTVar27;
  auVar14._0_8_ = uVar38;
  auVar14._16_8_ = other;
  auVar14._24_8_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_510;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,pTVar39,input_transaction_00,0,(int)local_520,input_signing_key_00,
             (CScript)(auVar14 << 0x40),in_stack_fffffffffffff598,(bool)uVar40);
  if (0x1c < local_13c) {
    free(local_158.indirect_contents.indirect);
    local_158.indirect_contents.indirect = (char *)0x0;
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_518._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_518,
               local_518._M_head_impl);
  }
  local_518._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_508 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508);
  }
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_parent,(allocator<CTransaction> *)&result_3gen_submit
             ,&mtx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_parent_child,&tx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_3gen,&tx_parent);
  GenerateRandomKey(SUB81((CKey *)local_540,0));
  CKey::GetPubKey((CPubKey *)&mtx_grandchild,(CKey *)local_540);
  PKHash::PKHash((PKHash *)&mtx_child,(CPubKey *)&mtx_grandchild);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_3gen_submit.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination
            ((CScript *)&local_178.indirect_contents,(CTxDestination *)&result_3gen_submit);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_3gen_submit);
  local_550 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_548 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_560,(CKey *)local_3b8);
  uVar38 = 0x68a1e6;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_218.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_178.indirect_contents);
  input_signing_key_01.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x11e1a3000;
  input_signing_key_01._0_8_ = &local_218;
  auVar15._8_8_ = pTVar27;
  auVar15._0_8_ = uVar38;
  auVar15._16_8_ = other;
  auVar15._24_8_ = 0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_550;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child,pTVar39,input_transaction_01,0x65,(int)local_560,input_signing_key_01,
             (CScript)(auVar15 << 0x40),in_stack_fffffffffffff598,(bool)uVar40);
  if (0x1c < local_1fc) {
    free(local_218.indirect_contents.indirect);
    local_218.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_558._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_558,
               local_558._M_head_impl);
  }
  local_558._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_548 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548);
  }
  tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child,(allocator<CTransaction> *)&result_3gen_submit,
             &mtx_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_parent_child,&tx_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_3gen,&tx_child);
  GenerateRandomKey(SUB81((CKey *)local_580,0));
  CKey::GetPubKey((CPubKey *)&mtx_grandchild,(CKey *)local_580);
  PKHash::PKHash((PKHash *)&mtx_parent_invalid,(CPubKey *)&mtx_grandchild);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_3gen_submit.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination
            ((CScript *)&local_238.indirect_contents,(CTxDestination *)&result_3gen_submit);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_3gen_submit);
  local_590 = tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_588 = tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_5a0,(CKey *)local_540);
  uVar38 = 0x68a3b4;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_258.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_238.indirect_contents);
  input_signing_key_02.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x118244f00;
  input_signing_key_02._0_8_ = &local_258;
  auVar16._8_8_ = pTVar27;
  auVar16._0_8_ = uVar38;
  auVar16._16_8_ = other;
  auVar16._24_8_ = 0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_590;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_grandchild,pTVar39,input_transaction_02,0x65,(int)local_5a0,input_signing_key_02,
             (CScript)(auVar16 << 0x40),in_stack_fffffffffffff598,(bool)uVar40);
  if (0x1c < local_23c) {
    free(local_258.indirect_contents.indirect);
    local_258.indirect_contents.indirect = (char *)0x0;
  }
  if (local_598._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_598,
               local_598._M_head_impl);
  }
  local_598._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_588 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_588);
  }
  tx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_grandchild,
             (allocator<CTransaction> *)&result_3gen_submit,&mtx_grandchild);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_3gen,&tx_grandchild);
  pCVar20 = ChainstateManager::ActiveChainstate
                      ((pTVar39->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar32 = &mtx_parent_invalid;
  auVar8[0xf] = 0;
  auVar8._0_15_ =
       (undefined1  [15])
       mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._9_15_;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._8_16_ = auVar8 << 8;
  pvVar29 = (iterator)0x0;
  ProcessNewPackage(&result_3gen_submit,pCVar20,
                    (pTVar39->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_3gen,false,
                    (optional<CFeeRate> *)pCVar32);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar41 = 0x68a4fa;
  file_03.m_end = (iterator)0x19c;
  file_03.m_begin = (iterator)&local_5c0;
  msg_03.m_end = (iterator)pCVar32;
  msg_03.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5d0,
             msg_03);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode == M_INVALID
  ;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = (undefined1  [16])0x0;
  local_58 = (undefined1  [8])0xf44889;
  local_50 = (undefined1  [8])"";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5d8 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             _cVar41,(size_t)&local_5e0,0x19c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x19d;
  file_04.m_begin = (iterator)&local_5f0;
  msg_04.m_end = pvVar31;
  msg_04.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_600,
             msg_04);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result;
  local_380 = (undefined1  [8])&package_invalid_parent;
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(package_invalid_parent.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                (result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result
                == PCKG_POLICY);
  _local_70 = (undefined1  [16])0x0;
  local_6f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6f0.m_message.px = (element_type *)0xf4389f;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&package_missing_parent;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = SUB81(&bad_witness,0);
  uVar40 = package_missing_parent.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_1_;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)((ulong)&bad_witness >> 8);
  uVar17 = package_missing_parent.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start._1_7_;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e0e0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = local_380;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0e0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf448b0,
             (size_t)&local_6f0,0x19d,&mtx_parent_invalid,"PackageValidationResult::PCKG_POLICY",
             (int)(assertion_result *)&err_parent_invalid);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x19e;
  file_05.m_begin = (iterator)&local_610;
  msg_05.m_end = pvVar31;
  msg_05.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_620,
             msg_05);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_78 = (undefined1  [8])&aStack_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p,
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p +
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_string_length);
  iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "package-not-child-with-parents");
  local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar18 == 0);
  local_6f0.m_message.px = (element_type *)0x0;
  local_6f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x37;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0xf438;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf4389f;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_380;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)"package-not-child-with-parents";
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e160;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  local_380 = (undefined1  [8])local_78;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = &bad_witness;
  boost::test_tools::tt_detail::report_assertion
            (&local_6f0,(lazy_ostream *)local_58,1,2,REQUIRE,0xf448d7,
             (size_t)&package_missing_parent,0x19e,&mtx_parent_invalid,
             "\"package-not-child-with-parents\"",(int)&err_parent_invalid);
  boost::detail::shared_count::~shared_count(&local_6f0.m_message.pn);
  if (local_78 != (undefined1  [8])&aStack_68) {
    operator_delete((void *)local_78,aStack_68._M_allocated_capacity + 1);
  }
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x19f;
  file_06.m_begin = (iterator)&local_630;
  msg_06.m_end = pvVar31;
  msg_06.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_640,
             msg_06);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  pvVar21 = (pointer)CTxMemPool::size((pTVar27->super_TestingSetup).super_ChainTestingSetup.
                                      super_BasicTestingSetup.m_node.mempool._M_t.
                                      super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                      .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pvVar21;
  local_78[0] = (class_property<bool>)
                (class_property<bool>)(pvVar21 == (pointer)(ulong)expected_pool_size);
  _local_70 = (undefined1  [16])0x0;
  local_6f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6f0.m_message.px = (element_type *)0xf4389f;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_380 = (undefined1  [8])&expected_pool_size;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f88;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = local_380;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = uVar40;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = uVar17;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&package_missing_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44395,
             (size_t)&local_6f0,0x19f,&mtx_parent_invalid,"expected_pool_size",
             (int)&err_parent_invalid);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&result_3gen_submit.m_tx_results._M_t);
  pTVar39 = pTVar27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
         _M_dataplus._M_p !=
      &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
       field_2) {
    operator_delete(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message._M_dataplus._M_p,
                    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p !=
      &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2) {
    operator_delete(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason._M_dataplus._M_p,
                    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason.field_2._M_allocated_capacity + 1);
  }
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode = M_INVALID;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&bad_witness.stack,(int *)&result_3gen_submit);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&mtx_parent_invalid.vin,&mtx_parent.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&mtx_parent_invalid.vout,&mtx_parent.vout);
  mtx_parent_invalid.version = mtx_parent.version;
  mtx_parent_invalid.nLockTime = mtx_parent.nLockTime;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&bad_witness.stack);
  tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_parent_invalid,
             (allocator<CTransaction> *)&result_3gen_submit,&mtx_parent_invalid);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       (size_type)tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       (size_type)
       tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&result_3gen_submit;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_invalid_parent,__l,(allocator_type *)&err_parent_invalid);
  lVar28 = 0x20;
  do {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&mtx_parent_invalid.version + lVar28);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    lVar28 = lVar28 + -0x10;
  } while (lVar28 != 0);
  pCVar20 = ChainstateManager::ActiveChainstate
                      ((pTVar27->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate_00 = &err_parent_invalid;
  auVar9[0xf] = 0;
  auVar9._0_15_ =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_15_;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = auVar9 << 8;
  ProcessNewPackage(&result_3gen_submit,pCVar20,
                    (pTVar27->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_invalid_parent,
                    false,(optional<CFeeRate> *)client_maxfeerate_00);
  pCVar30 = (pTVar27->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
            mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (&err_parent_invalid,&package_invalid_parent,&result_3gen_submit,false,pCVar30);
  if (err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_690 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_688 = "";
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar41 = 0x68ac9b;
    file_07.m_end = (iterator)0x1ae;
    file_07.m_begin = (iterator)&local_690;
    msg_07.m_end = (iterator)client_maxfeerate_00;
    msg_07.m_begin = (iterator)pCVar30;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_6a0,
               msg_07);
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffffffffff00);
    _local_70 = (undefined1  [16])0x0;
    if (err_parent_invalid.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_0068de03;
    }
    local_50 = (undefined1  [8])(local_50._1_8_ << 8);
    local_58 = (undefined1  [8])&PTR__lazy_ostream_01388e08;
    asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_48[1].pi_ = (sp_counted_base *)&err_parent_invalid;
    local_6b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6a8 = "";
    pvVar29 = (iterator)0x1;
    pvVar31 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,1,WARN,_cVar41,
               (size_t)&local_6b0,0x1ae);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  }
  else {
    iVar22 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_3gen_submit.m_tx_results._M_t,
                    &((tx_parent_invalid.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    iVar23 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_3gen_submit.m_tx_results._M_t,
                    &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_6c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6b8 = "";
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x1b2;
    file_08.m_begin = (iterator)&local_6c0;
    msg_08.m_end = (iterator)client_maxfeerate_00;
    msg_08.m_begin = (iterator)pCVar30;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_6d0,
               msg_08);
    local_6f0.m_message.px = (element_type *)(local_6f0.m_message._1_8_ << 8);
    local_6f0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_6f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_6d8 = "";
    iVar18 = *(int *)((long)&iVar22._M_node[2]._M_parent + 4);
    local_390._0_8_ = &local_3a0;
    local_3a0 = (char *)CONCAT44(local_3a0._4_4_,iVar18);
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = iVar18 == 7;
    local_398 = (undefined1  [8])&local_6f4;
    local_6f4 = 7;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_380 = (undefined1  [8])0xf43837;
    local_378._0_8_ = "";
    asStack_48[1].pi_ = (sp_counted_base *)local_390;
    local_50 = (undefined1  [8])(local_50._1_8_ << 8);
    local_58 = (undefined1  [8])&PTR__lazy_ostream_0138e1a0;
    asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    aStack_68._8_8_ = local_398;
    local_70 = (undefined1  [8])(local_70._1_8_ << 8);
    local_78 = (undefined1  [8])&PTR__lazy_ostream_0138e1a0;
    aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar29 = (iterator)0x1;
    pvVar31 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&package_missing_parent,(lazy_ostream *)&local_6f0,1,2,REQUIRE,
               0xf44904,(size_t)local_380,0x1b2,local_58,"TxValidationResult::TX_WITNESS_MUTATED",
               (int)local_78);
    ppsVar1 = &package_missing_parent.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boost::detail::shared_count::~shared_count((shared_count *)ppsVar1);
    local_708 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_700 = "";
    local_718 = &boost::unit_test::basic_cstring<char_const>::null;
    local_710 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x1b3;
    file_09.m_begin = (iterator)&local_708;
    msg_09.m_end = pvVar31;
    msg_09.m_begin = pvVar29;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_718,
               msg_09);
    local_6f0.m_message.px = (element_type *)(local_6f0.m_message._1_8_ << 8);
    local_6f0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_6f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_6d8 = "";
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = SUB81(ppsVar1,0);
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)((ulong)ppsVar1 >> 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&package_missing_parent,iVar22._M_node[2]._M_left,
               (long)&(iVar22._M_node[2]._M_left)->_M_color +
               (long)&(iVar22._M_node[2]._M_right)->_M_color);
    iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &package_missing_parent,"bad-witness-nonstandard");
    local_380[0] = iVar18 == 0;
    local_378 = (undefined1  [16])0x0;
    local_390._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_390._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68;
    local_50 = (undefined1  [8])(local_50._1_8_ << 8);
    local_58 = (undefined1  [8])&PTR__lazy_ostream_01388fc8;
    asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_48[1].pi_ = (sp_counted_base *)local_398;
    local_3a0 = "bad-witness-nonstandard";
    local_70 = (undefined1  [8])(local_70._1_8_ << 8);
    local_78 = (undefined1  [8])&PTR__lazy_ostream_0138dfe0;
    aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_68._8_8_ = &local_3a0;
    pvVar29 = (iterator)0x1;
    pvVar31 = (iterator)0x2;
    local_398 = (undefined1  [8])&package_missing_parent;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_380,(lazy_ostream *)&local_6f0,1,2,REQUIRE,0xf44951,
               (size_t)local_390,0x1b3,local_58,"\"bad-witness-nonstandard\"",(int)local_78);
    boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
    pTVar27 = pTVar39;
    if ((pointer *)
        CONCAT71(package_missing_parent.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                 package_missing_parent.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_1_) != ppsVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(package_missing_parent.
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               package_missing_parent.
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_),
                      (ulong)((long)&((package_missing_parent.
                                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + 1));
      pTVar27 = pTVar39;
    }
    local_728 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_720 = "";
    local_738 = &boost::unit_test::basic_cstring<char_const>::null;
    local_730 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x1b4;
    file_10.m_begin = (iterator)&local_728;
    msg_10.m_end = pvVar31;
    msg_10.m_begin = pvVar29;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_738,
               msg_10);
    local_6f0.m_message.px = (element_type *)(local_6f0.m_message._1_8_ << 8);
    local_6f0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_6f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_6d8 = "";
    iVar18 = *(int *)((long)&iVar23._M_node[2]._M_parent + 4);
    local_3a0 = (char *)CONCAT44(local_3a0._4_4_,iVar18);
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = iVar18 == 5;
    local_6f4 = 5;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_380 = (undefined1  [8])0xf43837;
    local_378._0_8_ = "";
    local_390._0_8_ = &local_3a0;
    local_50 = (undefined1  [8])(local_50._1_8_ << 8);
    local_58 = (undefined1  [8])&PTR__lazy_ostream_0138e1a0;
    asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_398 = (undefined1  [8])&local_6f4;
    local_70 = (undefined1  [8])(local_70._1_8_ << 8);
    local_78 = (undefined1  [8])&PTR__lazy_ostream_0138e1a0;
    aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_68._8_8_ = local_398;
    pvVar29 = (iterator)0x1;
    pvVar31 = (iterator)0x2;
    asStack_48[1].pi_ = (sp_counted_base *)local_390;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&package_missing_parent,(lazy_ostream *)&local_6f0,1,2,REQUIRE,
               0xf449af,(size_t)local_380,0x1b4,local_58,"TxValidationResult::TX_MISSING_INPUTS",
               (int)local_78);
    ppsVar1 = &package_missing_parent.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boost::detail::shared_count::~shared_count((shared_count *)ppsVar1);
    local_748 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_740 = "";
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    local_750 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x1b5;
    file_11.m_begin = (iterator)&local_748;
    msg_11.m_end = pvVar31;
    msg_11.m_begin = pvVar29;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_758,
               msg_11);
    local_6f0.m_message.px = (element_type *)(local_6f0.m_message._1_8_ << 8);
    local_6f0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_6f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_6d8 = "";
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = SUB81(ppsVar1,0);
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)((ulong)ppsVar1 >> 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&package_missing_parent,iVar23._M_node[2]._M_left,
               (long)&(iVar23._M_node[2]._M_left)->_M_color +
               (long)&(iVar23._M_node[2]._M_right)->_M_color);
    iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &package_missing_parent,"bad-txns-inputs-missingorspent");
    local_380[0] = iVar18 == 0;
    local_378 = (undefined1  [16])0x0;
    local_390._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_390._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68;
    local_50 = (undefined1  [8])(local_50._1_8_ << 8);
    local_58 = (undefined1  [8])&PTR__lazy_ostream_01388fc8;
    asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_48[1].pi_ = (sp_counted_base *)local_398;
    local_3a0 = "bad-txns-inputs-missingorspent";
    local_70 = (undefined1  [8])(local_70._1_8_ << 8);
    local_78 = (undefined1  [8])&PTR__lazy_ostream_0138e160;
    aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_68._8_8_ = &local_3a0;
    pvVar29 = (iterator)0x1;
    pvVar31 = (iterator)0x2;
    local_398 = (undefined1  [8])&package_missing_parent;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_380,(lazy_ostream *)&local_6f0,1,2,REQUIRE,0xf449fa,
               (size_t)local_390,0x1b5,local_58,"\"bad-txns-inputs-missingorspent\"",(int)local_78);
    boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
    pTVar39 = pTVar27;
    if ((pointer *)
        CONCAT71(package_missing_parent.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                 package_missing_parent.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_1_) != ppsVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(package_missing_parent.
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               package_missing_parent.
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_),
                      (ulong)((long)&((package_missing_parent.
                                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + 1));
    }
  }
  if ((err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     err_parent_invalid.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&err_parent_invalid.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)err_parent_invalid.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    err_parent_invalid.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1b7;
  file_12.m_begin = (iterator)&local_768;
  msg_12.m_end = pvVar31;
  msg_12.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_778,
             msg_12);
  local_70 = (undefined1  [8])(local_70._1_8_ << 8);
  local_78 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_380 = (undefined1  [8])local_398;
  local_398._0_4_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result;
  local_390._0_8_ = &local_3a0;
  local_3a0 = (char *)CONCAT44(local_3a0._4_4_,2);
  local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result ==
       PCKG_TX);
  local_6f0.m_message.px = (element_type *)0x0;
  local_6f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x37;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0xf438;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf4389f;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0e0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = local_380;
  asStack_48[1].pi_ = (sp_counted_base *)local_390;
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_0138e0e0;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_6f0,(lazy_ostream *)local_78,1,2,REQUIRE,0xf44a46,
             (size_t)&package_missing_parent,0x1b7,&err_parent_invalid,
             "PackageValidationResult::PCKG_TX",(int)local_58);
  boost::detail::shared_count::~shared_count(&local_6f0.m_message.pn);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&result_3gen_submit.m_tx_results._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
         _M_dataplus._M_p !=
      &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
       field_2) {
    operator_delete(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message._M_dataplus._M_p,
                    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p !=
      &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2) {
    operator_delete(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason._M_dataplus._M_p,
                    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_invalid_parent);
  if (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_parent_invalid.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_parent_invalid.vin);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&bad_witness.stack);
  peVar7 = ((package_unrelated.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       *(pointer *)((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       *(size_type *)((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       *(undefined8 *)((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_child.vin,(COutPoint *)&result_3gen_submit);
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_missing_parent,&tx_parent);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result =
       PCKG_RESULT_UNSET;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason,(CTransaction **)&result_3gen_submit,
             (allocator<CTransaction> *)&mtx_parent_invalid,&mtx_child);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&package_missing_parent,(shared_ptr<const_CTransaction> *)&result_3gen_submit);
  if (result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      _M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_dataplus._M_p);
  }
  pCVar20 = ChainstateManager::ActiveChainstate
                      ((pTVar27->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar32 = &mtx_parent_invalid;
  auVar10[0xf] = 0;
  auVar10._0_15_ =
       (undefined1  [15])
       mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._9_15_;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._8_16_ = auVar10 << 8;
  pvVar29 = (iterator)0x0;
  ProcessNewPackage(&result_3gen_submit,pCVar20,
                    (pTVar27->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_missing_parent,
                    false,(optional<CFeeRate> *)pCVar32);
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar41 = 0x68b700;
  file_13.m_end = (iterator)0x1c2;
  file_13.m_begin = (iterator)&local_788;
  msg_13.m_end = (iterator)pCVar32;
  msg_13.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_798,
             msg_13);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode == M_INVALID
  ;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = (undefined1  [16])0x0;
  local_58 = (undefined1  [8])0xf44a6c;
  local_50 = (undefined1  [8])"";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7a0 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             _cVar41,(size_t)&local_7a8,0x1c2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x1c3;
  file_14.m_begin = (iterator)&local_7b8;
  msg_14.m_end = pvVar31;
  msg_14.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_7c8,
             msg_14);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(package_invalid_parent.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                         m_result);
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                (result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result
                == PCKG_POLICY);
  local_390._0_4_ = 1;
  _local_70 = (undefined1  [16])0x0;
  local_6f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6f0.m_message.px = (element_type *)0xf4389f;
  local_380 = (undefined1  [8])&package_invalid_parent;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e0e0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_380;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_390;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0e0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = &bad_witness;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44a96,
             (size_t)&local_6f0,0x1c3,&mtx_parent_invalid,"PackageValidationResult::PCKG_POLICY",
             (int)(assertion_result *)&err_parent_invalid);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x1c4;
  file_15.m_begin = (iterator)&local_7d8;
  msg_15.m_end = pvVar31;
  msg_15.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_7e8,
             msg_15);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_78 = (undefined1  [8])&aStack_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p,
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p +
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_string_length);
  iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "package-not-child-with-unconfirmed-parents");
  local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar18 == 0);
  local_6f0.m_message.px = (element_type *)0x0;
  local_6f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf43837;
  local_378._0_8_ = "";
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&bad_witness;
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19d6702;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138ca00;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = &package_invalid_parent;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  uVar37 = SUB84((pointer)&err_parent_invalid,0);
  boost::test_tools::tt_detail::report_assertion
            (&local_6f0,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44ac0,(size_t)local_380,0x1c4,
             &mtx_parent_invalid,"\"package-not-child-with-unconfirmed-parents\"",uVar37);
  boost::detail::shared_count::~shared_count(&local_6f0.m_message.pn);
  pTVar27 = pTVar39;
  if (local_78 != (undefined1  [8])&aStack_68) {
    operator_delete((void *)local_78,aStack_68._M_allocated_capacity + 1);
  }
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x1c5;
  file_16.m_begin = (iterator)&local_7f8;
  msg_16.m_end = pvVar31;
  msg_16.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_808,
             msg_16);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((pTVar39->super_TestingSetup).super_ChainTestingSetup.
                                 super_BasicTestingSetup.m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                (package_invalid_parent.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == (pointer)(ulong)expected_pool_size);
  _local_70 = (undefined1  [16])0x0;
  local_6f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6f0.m_message.px = (element_type *)0xf4389f;
  local_380 = (undefined1  [8])&package_invalid_parent;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_380;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&expected_pool_size;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f88;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = &bad_witness;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44395,
             (size_t)&local_6f0,0x1c5,&mtx_parent_invalid,"expected_pool_size",uVar37);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&result_3gen_submit.m_tx_results._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
         _M_dataplus._M_p !=
      &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
       field_2) {
    operator_delete(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message._M_dataplus._M_p,
                    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p !=
      &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2) {
    operator_delete(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason._M_dataplus._M_p,
                    result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason.field_2._M_allocated_capacity + 1);
  }
  pCVar20 = ChainstateManager::ActiveChainstate
                      ((pTVar39->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar32 = &mtx_parent_invalid;
  auVar11[0xf] = 0;
  auVar11._0_15_ =
       (undefined1  [15])
       mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._9_15_;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._8_16_ = auVar11 << 8;
  pvVar29 = (iterator)0x0;
  ProcessNewPackage(&result_3gen_submit,pCVar20,
                    (pTVar39->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_parent_child,
                    false,(optional<CFeeRate> *)pCVar32);
  expected_pool_size = expected_pool_size + 2;
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x1ce;
  file_17.m_begin = (iterator)&local_818;
  msg_17.m_end = (iterator)pCVar32;
  msg_17.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_828,
             msg_17);
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                (result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode ==
                M_VALID);
  _local_70 = (undefined1  [16])0x0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01389f50;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = anon_var_dwarf_19d671c;
  _cVar41 = 0x68bd86;
  local_58 = (undefined1  [8])(local_50 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p,
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_dataplus._M_p +
             result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason._M_string_length);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e1e0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&err_parent_invalid;
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_830 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x1;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)&mtx_parent_invalid,1,1,WARN,_cVar41,
             (size_t)&local_838,0x1ce);
  if (local_58 != (undefined1  [8])(local_50 + 8)) {
    operator_delete((void *)local_58,(long)asStack_48[0].pi_ + 1);
  }
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x1cf;
  file_18.m_begin = (iterator)&local_848;
  msg_18.m_end = pvVar31;
  msg_18.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_858,
             msg_18);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)result_3gen_submit.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_390._0_8_ =
       (long)package_parent_child.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)package_parent_child.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                (result_3gen_submit.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                local_390._0_8_);
  _local_70 = (undefined1  [16])0x0;
  local_6f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6f0.m_message.px = (element_type *)0xf4389f;
  local_380 = (undefined1  [8])&package_invalid_parent;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_380;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f48;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = &bad_witness;
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x2;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_390;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44b71,
             (size_t)&local_6f0,0x1cf,&mtx_parent_invalid,"package_parent_child.size()",uVar37);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  cVar24 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&result_3gen_submit.m_tx_results._M_t,
                  &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar25 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&result_3gen_submit.m_tx_results._M_t,
                  &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_860 = "";
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar41 = 0x68c000;
  file_19.m_end = (iterator)0x1d2;
  file_19.m_begin = (iterator)&local_868;
  msg_19.m_end = pvVar31;
  msg_19.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_878,
             msg_19);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       (_Rb_tree_header *)cVar24._M_node !=
       &result_3gen_submit.m_tx_results._M_t._M_impl.super__Rb_tree_header;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = (undefined1  [16])0x0;
  local_58 = (undefined1  [8])0xf44bb5;
  local_50 = (undefined1  [8])0xf44be8;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_880 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             _cVar41,(size_t)&local_888,0x1d2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_890 = "";
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar41 = 0x68c0e1;
  file_20.m_end = (iterator)0x1d3;
  file_20.m_begin = (iterator)&local_898;
  msg_20.m_end = pvVar31;
  msg_20.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_8a8,
             msg_20);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = *(int *)&cVar24._M_node[2]._M_parent == 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = (undefined1  [16])0x0;
  local_58 = (undefined1  [8])0xf44be9;
  local_50 = (undefined1  [8])0xf44c0c;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8b0 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             _cVar41,(size_t)&local_8b8,0x1d3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x1d4;
  file_21.m_begin = (iterator)&local_8c8;
  msg_21.m_end = pvVar31;
  msg_21.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_8d8,
             msg_21);
  local_6f0._0_8_ = (_func_int **)0x5f5e100;
  iVar26 = GetVirtualTransactionSize
                     (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0,0);
  _cVar41 = 0x68c1f1;
  CFeeRate::CFeeRate((CFeeRate *)local_78,(CAmount *)&local_6f0,(uint32_t)iVar26);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       (undefined1  [8])cVar24._M_node[6]._M_parent == local_78 &
       *(byte *)&cVar24._M_node[6]._M_left;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = (undefined1  [16])0x0;
  local_58 = (undefined1  [8])0xf44c0d;
  local_50 = (undefined1  [8])"";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8e0 = "";
  pvVar29 = (iterator)0x1;
  pvVar31 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             _cVar41,(size_t)&local_8e8,0x1d4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x1d5;
  file_22.m_begin = (iterator)&local_8f8;
  msg_22.m_end = pvVar31;
  msg_22.m_begin = pvVar29;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_908,
             msg_22);
  local_50 = (undefined1  [8])(local_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
  if (*(char *)&cVar24._M_node[7]._M_left == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    lVar28 = *(long *)(cVar24._M_node + 7) - (long)cVar24._M_node[6]._M_right;
    package_invalid_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar28 >> 5);
    local_390._0_4_ = 1;
    local_78[0] = (class_property<bool>)(class_property<bool>)(lVar28 == 0x20);
    _local_70 = (undefined1  [16])0x0;
    local_6f0._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6f0.m_message.px = (element_type *)0xf4389f;
    local_380 = (undefined1  [8])&package_invalid_parent;
    mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._9_8_ << 8);
    mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
    mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_380;
    bad_witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_390;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_parent_invalid.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_013890c8;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &bad_witness;
    pvVar29 = (iterator)0x1;
    pvVar31 = (iterator)0x2;
    uVar37 = SUB84((assertion_result *)&err_parent_invalid,0);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf440fd,
               (size_t)&local_6f0,0x1d5,&mtx_parent_invalid,"1",uVar37);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
    local_918 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_910 = "";
    local_928 = &boost::unit_test::basic_cstring<char_const>::null;
    local_920 = &boost::unit_test::basic_cstring<char_const>::null;
    file_23.m_end = (iterator)0x1d6;
    file_23.m_begin = (iterator)&local_918;
    msg_23.m_end = pvVar31;
    msg_23.m_begin = pvVar29;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_928,
               msg_23);
    local_50 = (undefined1  [8])(local_50._1_8_ << 8);
    local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
    asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    if (*(char *)&cVar24._M_node[7]._M_left == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_380 = (undefined1  [8])cVar24._M_node[6]._M_right;
      bad_witness.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&(tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash;
      uVar2 = ((_Base_ptr)local_380)->_M_left;
      uVar4 = ((_Base_ptr)local_380)->_M_right;
      auVar35[0] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                    (char)((_Base_ptr)local_380)->_M_color);
      auVar35[1] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                    *(byte *)((long)&((_Base_ptr)local_380)->_M_color + 1));
      auVar35[2] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                    *(byte *)((long)&((_Base_ptr)local_380)->_M_color + 2));
      auVar35[3] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                    *(byte *)((long)&((_Base_ptr)local_380)->_M_color + 3));
      auVar35[4] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                    ((_Base_ptr)local_380)->field_0x4);
      auVar35[5] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                    ((_Base_ptr)local_380)->field_0x5);
      auVar35[6] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                    ((_Base_ptr)local_380)->field_0x6);
      auVar35[7] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                    ((_Base_ptr)local_380)->field_0x7);
      auVar35[8] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                    *(uchar *)&((_Base_ptr)local_380)->_M_parent);
      auVar35[9] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                    *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 1));
      auVar35[10] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]
                     == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 2));
      auVar35[0xb] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 3));
      auVar35[0xc] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 4));
      auVar35[0xd] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 5));
      auVar35[0xe] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 6));
      auVar35[0xf] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 7));
      auVar33[0] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                    == (uchar)uVar2);
      auVar33[1] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                    == (uchar)((ulong)uVar2 >> 8));
      auVar33[2] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                    == (uchar)((ulong)uVar2 >> 0x10));
      auVar33[3] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                    == (uchar)((ulong)uVar2 >> 0x18));
      auVar33[4] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]
                    == (uchar)((ulong)uVar2 >> 0x20));
      auVar33[5] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]
                    == (uchar)((ulong)uVar2 >> 0x28));
      auVar33[6] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]
                    == (uchar)((ulong)uVar2 >> 0x30));
      auVar33[7] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]
                    == (uchar)((ulong)uVar2 >> 0x38));
      auVar33[8] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]
                    == (uchar)uVar4);
      auVar33[9] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]
                    == (uchar)((ulong)uVar4 >> 8));
      auVar33[10] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x1a] == (uchar)((ulong)uVar4 >> 0x10));
      auVar33[0xb] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      (uchar)((ulong)uVar4 >> 0x18));
      auVar33[0xc] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      (uchar)((ulong)uVar4 >> 0x20));
      auVar33[0xd] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      (uchar)((ulong)uVar4 >> 0x28));
      auVar33[0xe] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      (uchar)((ulong)uVar4 >> 0x30));
      auVar33[0xf] = -(((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      (uchar)((ulong)uVar4 >> 0x38));
      auVar33 = auVar33 & auVar35;
      local_78[0] = (class_property<bool>)
                    (class_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff);
      _local_70 = (undefined1  [16])0x0;
      local_6f0._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
      ;
      local_6f0.m_message.px = (element_type *)0xf4389f;
      mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                     _M_impl.super__Vector_impl_data._9_8_ << 8);
      mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e0a0;
      mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_380;
      err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length =
           err_parent_invalid.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._9_8_ << 8;
      err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0a0;
      err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
      err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_8_ = &bad_witness;
      pvVar29 = (iterator)0x1;
      pvVar31 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44138,
                 (size_t)&local_6f0,0x1d6,&mtx_parent_invalid,"tx_parent->GetWitnessHash()",uVar37);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_938 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
      ;
      local_930 = "";
      local_948 = &boost::unit_test::basic_cstring<char_const>::null;
      local_940 = &boost::unit_test::basic_cstring<char_const>::null;
      file_24.m_end = (iterator)0x1d7;
      file_24.m_begin = (iterator)&local_938;
      msg_24.m_end = pvVar31;
      msg_24.m_begin = pvVar29;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_948,
                 msg_24);
      local_6f0._0_8_ = (_func_int **)0x5f5e100;
      iVar26 = GetVirtualTransactionSize
                         (tx_child.
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          0,0);
      _cVar41 = 0x68c664;
      CFeeRate::CFeeRate((CFeeRate *)local_78,(CAmount *)&local_6f0,(uint32_t)iVar26);
      err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._0_1_ =
           (undefined1  [8])cVar25._M_node[6]._M_parent == local_78 &
           *(byte *)&cVar25._M_node[6]._M_left;
      err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._8_16_ = (undefined1  [16])0x0;
      local_58 = (undefined1  [8])0xf44c70;
      local_50 = (undefined1  [8])"";
      mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                     _M_impl.super__Vector_impl_data._9_8_ << 8);
      mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
      mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_958 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
      ;
      local_950 = "";
      pvVar29 = (iterator)0x1;
      pvVar31 = (iterator)0x0;
      mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_58;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,
                 WARN,_cVar41,(size_t)&local_958,0x1d7);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&err_parent_invalid.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10));
      local_968 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
      ;
      local_960 = "";
      local_978 = &boost::unit_test::basic_cstring<char_const>::null;
      local_970 = &boost::unit_test::basic_cstring<char_const>::null;
      file_25.m_end = (iterator)0x1d8;
      file_25.m_begin = (iterator)&local_968;
      msg_25.m_end = pvVar31;
      msg_25.m_begin = pvVar29;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_978,
                 msg_25);
      local_50 = (undefined1  [8])(local_50._1_8_ << 8);
      local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
      asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
      if (*(char *)&cVar25._M_node[7]._M_left == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        lVar28 = *(long *)(cVar25._M_node + 7) - (long)cVar25._M_node[6]._M_right;
        package_invalid_parent.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar28 >> 5);
        local_390._0_4_ = 1;
        local_78[0] = (class_property<bool>)(class_property<bool>)(lVar28 == 0x20);
        _local_70 = (undefined1  [16])0x0;
        local_6f0._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_6f0.m_message.px = (element_type *)0xf4389f;
        local_380 = (undefined1  [8])&package_invalid_parent;
        mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                       _M_impl.super__Vector_impl_data._9_8_ << 8);
        mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
        mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_380;
        bad_witness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_390;
        err_parent_invalid.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length =
             err_parent_invalid.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._9_8_ << 8;
        err_parent_invalid.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_013890c8;
        err_parent_invalid.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
        err_parent_invalid.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ = &bad_witness;
        pvVar29 = (iterator)0x1;
        pvVar31 = (iterator)0x2;
        uVar37 = SUB84((assertion_result *)&err_parent_invalid,0);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf441f2,
                   (size_t)&local_6f0,0x1d8,&mtx_parent_invalid,"1",uVar37);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity)
        ;
        local_988 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
        ;
        local_980 = "";
        local_998 = &boost::unit_test::basic_cstring<char_const>::null;
        local_990 = &boost::unit_test::basic_cstring<char_const>::null;
        file_26.m_end = (iterator)0x1d9;
        file_26.m_begin = (iterator)&local_988;
        msg_26.m_end = pvVar31;
        msg_26.m_begin = pvVar29;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_998
                   ,msg_26);
        local_50 = (undefined1  [8])(local_50._1_8_ << 8);
        local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
        asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
        if (*(char *)&cVar25._M_node[7]._M_left == '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          local_380 = (undefined1  [8])cVar25._M_node[6]._M_right;
          bad_witness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&(tx_child.
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->m_witness_hash;
          uVar3 = ((_Base_ptr)local_380)->_M_left;
          uVar5 = ((_Base_ptr)local_380)->_M_right;
          auVar36[0] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                        (char)((_Base_ptr)local_380)->_M_color);
          auVar36[1] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                        *(byte *)((long)&((_Base_ptr)local_380)->_M_color + 1));
          auVar36[2] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                        *(byte *)((long)&((_Base_ptr)local_380)->_M_color + 2));
          auVar36[3] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                        *(byte *)((long)&((_Base_ptr)local_380)->_M_color + 3));
          auVar36[4] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                        ((_Base_ptr)local_380)->field_0x4);
          auVar36[5] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                        ((_Base_ptr)local_380)->field_0x5);
          auVar36[6] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                        ((_Base_ptr)local_380)->field_0x6);
          auVar36[7] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                        ((_Base_ptr)local_380)->field_0x7);
          auVar36[8] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                        *(uchar *)&((_Base_ptr)local_380)->_M_parent);
          auVar36[9] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                        *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 1));
          auVar36[10] = -(((tx_child.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                          [10] == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 2));
          auVar36[0xb] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xb] == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 3));
          auVar36[0xc] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xc] == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 4));
          auVar36[0xd] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xd] == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 5));
          auVar36[0xe] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xe] == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 6));
          auVar36[0xf] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xf] == *(uchar *)((long)&((_Base_ptr)local_380)->_M_parent + 7));
          auVar34[0] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                        == (uchar)uVar3);
          auVar34[1] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                        == (uchar)((ulong)uVar3 >> 8));
          auVar34[2] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                        == (uchar)((ulong)uVar3 >> 0x10));
          auVar34[3] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                        == (uchar)((ulong)uVar3 >> 0x18));
          auVar34[4] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]
                        == (uchar)((ulong)uVar3 >> 0x20));
          auVar34[5] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]
                        == (uchar)((ulong)uVar3 >> 0x28));
          auVar34[6] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]
                        == (uchar)((ulong)uVar3 >> 0x30));
          auVar34[7] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]
                        == (uchar)((ulong)uVar3 >> 0x38));
          auVar34[8] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]
                        == (uchar)uVar5);
          auVar34[9] = -(((tx_child.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]
                        == (uchar)((ulong)uVar5 >> 8));
          auVar34[10] = -(((tx_child.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                          [0x1a] == (uchar)((ulong)uVar5 >> 0x10));
          auVar34[0xb] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1b] == (uchar)((ulong)uVar5 >> 0x18));
          auVar34[0xc] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1c] == (uchar)((ulong)uVar5 >> 0x20));
          auVar34[0xd] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1d] == (uchar)((ulong)uVar5 >> 0x28));
          auVar34[0xe] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1e] == (uchar)((ulong)uVar5 >> 0x30));
          auVar34[0xf] = -(((tx_child.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1f] == (uchar)((ulong)uVar5 >> 0x38));
          auVar34 = auVar34 & auVar36;
          _local_70 = (undefined1  [16])0x0;
          local_6f0._0_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
          ;
          local_6f0.m_message.px = (element_type *)0xf4389f;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._9_8_ << 8);
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138e0a0;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_380;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length =
               err_parent_invalid.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._9_8_ << 8;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0a0;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = &bad_witness;
          pvVar29 = (iterator)0x1;
          pvVar31 = (iterator)0x2;
          local_78[0] = (class_property<bool>)
                        (class_property<bool>)
                        ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff);
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf4422c,
                     (size_t)&local_6f0,0x1d9,&mtx_parent_invalid,"tx_child->GetWitnessHash()",
                     uVar37);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_68._M_allocated_capacity);
          local_9a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
          ;
          local_9a0 = "";
          local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_27.m_end = (iterator)0x1db;
          file_27.m_begin = (iterator)&local_9a8;
          msg_27.m_end = pvVar31;
          msg_27.m_begin = pvVar29;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                     (size_t)&local_9b8,msg_27);
          local_50 = (undefined1  [8])(local_50._1_8_ << 8);
          local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
          asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
          pTVar39 = pTVar27;
          package_invalid_parent.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CTxMemPool::size((pTVar27->super_TestingSetup).super_ChainTestingSetup.
                                         super_BasicTestingSetup.m_node.mempool._M_t.
                                         super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                         .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
          local_78[0] = (class_property<bool>)
                        (class_property<bool>)
                        (package_invalid_parent.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                        (pointer)(ulong)expected_pool_size);
          _local_70 = (undefined1  [16])0x0;
          local_6f0._0_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
          ;
          local_6f0.m_message.px = (element_type *)0xf4389f;
          local_380 = (undefined1  [8])&package_invalid_parent;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._9_8_ << 8);
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_380;
          bad_witness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&expected_pool_size;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length =
               err_parent_invalid.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._9_8_ << 8;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f88;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = &bad_witness;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44395,
                     (size_t)&local_6f0,0x1db,&mtx_parent_invalid,"expected_pool_size",
                     (int)&err_parent_invalid);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_68._M_allocated_capacity);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::~_Rb_tree(&result_3gen_submit.m_tx_results._M_t);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_debug_message._M_dataplus._M_p !=
              &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_debug_message.field_2) {
            operator_delete(result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_debug_message.
                            _M_dataplus._M_p,
                            result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
                            _M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_reject_reason._M_dataplus._M_p !=
              &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason.field_2) {
            operator_delete(result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_reject_reason.
                            _M_dataplus._M_p,
                            result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
                            _M_allocated_capacity + 1);
          }
          pCVar20 = ChainstateManager::ActiveChainstate
                              ((pTVar27->super_TestingSetup).super_ChainTestingSetup.
                               super_BasicTestingSetup.m_node.chainman._M_t.
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
          pCVar32 = &mtx_parent_invalid;
          auVar12[0xf] = 0;
          auVar12._0_15_ =
               (undefined1  [15])
               mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._9_15_;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._8_16_ = auVar12 << 8;
          ProcessNewPackage(&result_3gen_submit,pCVar20,
                            (pTVar27->super_TestingSetup).super_ChainTestingSetup.
                            super_BasicTestingSetup.m_node.mempool._M_t.
                            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
                            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
                            &package_parent_child,false,(optional<CFeeRate> *)pCVar32);
          pCVar30 = (pTVar27->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
          CheckPackageMempoolAcceptResult_abi_cxx11_
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&mtx_parent_invalid,&package_parent_child,&result_3gen_submit,true,pCVar30);
          if ((char)mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                    _M_impl.super__Vector_impl_data._M_finish == '\x01') {
            local_9c8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
            ;
            local_9c0 = "";
            local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar41 = 0x68ccfa;
            file_28.m_end = (iterator)0x1e3;
            file_28.m_begin = (iterator)&local_9c8;
            msg_28.m_end = (iterator)pCVar32;
            msg_28.m_begin = (iterator)pCVar30;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                       (size_t)&local_9d8,msg_28);
            local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
            _local_50 = (undefined1  [16])0x0;
            if ((char)mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                      _M_impl.super__Vector_impl_data._M_finish == '\0') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
              goto LAB_0068de03;
            }
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length =
                 err_parent_invalid.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._9_8_ << 8;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388e08;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
            local_9e8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
            ;
            local_9e0 = "";
            pvVar29 = (iterator)0x1;
            pvVar31 = (iterator)0x1;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = &mtx_parent_invalid;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)&err_parent_invalid,1,1,WARN,
                       _cVar41,(size_t)&local_9e8,0x1e3);
            boost::detail::shared_count::~shared_count((shared_count *)(local_50 + 8));
          }
          else {
            cVar24 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     ::find(&result_3gen_submit.m_tx_results._M_t,
                            &((tx_parent.
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->m_witness_hash).m_wrapped);
            cVar25 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     ::find(&result_3gen_submit.m_tx_results._M_t,
                            &((tx_child.
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->m_witness_hash).m_wrapped);
            local_9f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
            ;
            local_9f0 = "";
            local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
            local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar41 = 0x68cdf6;
            file_29.m_end = (iterator)0x1e7;
            file_29.m_begin = (iterator)&local_9f8;
            msg_29.m_end = (iterator)pCVar32;
            msg_29.m_begin = (iterator)pCVar30;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                       (size_t)&local_a08,msg_29);
            _local_50 = (undefined1  [16])0x0;
            local_78 = (undefined1  [8])0xf44cd1;
            local_70 = (undefined1  [8])0xf44d2a;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length =
                 err_parent_invalid.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._9_8_ << 8;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01389048;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
            local_a18 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
            ;
            local_a10 = "";
            pvVar29 = (iterator)0x1;
            pvVar31 = (iterator)0x0;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = (assertion_result *)local_78;
            local_58[0] = cVar24._M_node[2]._M_color == 2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)&err_parent_invalid,1,0,WARN,
                       _cVar41,(size_t)&local_a18,0x1e7);
            boost::detail::shared_count::~shared_count((shared_count *)(local_50 + 8));
            local_a28 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
            ;
            local_a20 = "";
            local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
            local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar41 = 0x68ceba;
            file_30.m_end = (iterator)0x1e8;
            file_30.m_begin = (iterator)&local_a28;
            msg_30.m_end = pvVar31;
            msg_30.m_begin = pvVar29;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                       (size_t)&local_a38,msg_30);
            local_58[0] = cVar25._M_node[2]._M_color == 2;
            _local_50 = (undefined1  [16])0x0;
            local_78 = (undefined1  [8])0xf44d2b;
            local_70 = (undefined1  [8])"";
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length =
                 err_parent_invalid.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._9_8_ << 8;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01389048;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
            local_a48 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
            ;
            local_a40 = "";
            pvVar29 = (iterator)0x1;
            pvVar31 = (iterator)0x0;
            err_parent_invalid.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = (assertion_result *)local_78;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)&err_parent_invalid,1,0,WARN,
                       _cVar41,(size_t)&local_a48,0x1e8);
            pTVar27 = pTVar39;
            boost::detail::shared_count::~shared_count((shared_count *)(local_50 + 8));
          }
          if (((char)mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                     _M_impl.super__Vector_impl_data._M_finish == '\x01') &&
             (mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = '\0',
             mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pointer)&mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)) {
            operator_delete(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)(((mtx_parent_invalid.vin.
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage)->prevout).hash.
                                    m_wrapped.super_base_blob<256U>.m_data._M_elems + 1));
          }
          local_a58 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
          ;
          local_a50 = "";
          file_31.m_end = (iterator)0x1eb;
          file_31.m_begin = (iterator)&local_a58;
          msg_31.m_end = pvVar31;
          msg_31.m_begin = pvVar29;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                     (size_t)&stack0xfffffffffffff598,msg_31);
          local_50 = (undefined1  [8])(local_50._1_8_ << 8);
          local_58 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
          asStack_48[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_48[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
          package_invalid_parent.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CTxMemPool::size((pTVar27->super_TestingSetup).super_ChainTestingSetup.
                                         super_BasicTestingSetup.m_node.mempool._M_t.
                                         super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                         .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
          local_78[0] = (class_property<bool>)
                        (class_property<bool>)
                        (package_invalid_parent.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                        (pointer)(ulong)expected_pool_size);
          _local_70 = (undefined1  [16])0x0;
          local_6f0._0_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
          ;
          local_6f0.m_message.px = (element_type *)0xf4389f;
          local_380 = (undefined1  [8])&package_invalid_parent;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._9_8_ << 8);
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
          mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_380;
          bad_witness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&expected_pool_size;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length =
               err_parent_invalid.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._9_8_ << 8;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f88;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
          err_parent_invalid.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = &bad_witness;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_78,(lazy_ostream *)local_58,1,2,REQUIRE,0xf44395,
                     (size_t)&local_6f0,0x1eb,&mtx_parent_invalid,"expected_pool_size",
                     (int)&err_parent_invalid);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_68._M_allocated_capacity);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::~_Rb_tree(&result_3gen_submit.m_tx_results._M_t);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_debug_message._M_dataplus._M_p !=
              &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_debug_message.field_2) {
            operator_delete(result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_debug_message.
                            _M_dataplus._M_p,
                            result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
                            _M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_reject_reason._M_dataplus._M_p !=
              &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason.field_2) {
            operator_delete(result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_reject_reason.
                            _M_dataplus._M_p,
                            result_3gen_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
                            _M_allocated_capacity + 1);
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&package_missing_parent);
          if (tx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (tx_grandchild.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_grandchild.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_grandchild.vin);
          if (0x1c < local_21c) {
            free(local_238.indirect_contents.indirect);
          }
          if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               )local_578._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
              (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
            SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                      ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_578,
                       (array<unsigned_char,_32UL> *)
                       local_578._M_t.
                       super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl
                      );
          }
          if (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_child.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_child.vin);
          if (0x1c < local_15c) {
            free((void *)CONCAT44(local_178._4_4_,local_178._0_4_));
          }
          if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               )local_538._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
              (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
            SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                      ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_538,
                       (array<unsigned_char,_32UL> *)
                       local_538._M_t.
                       super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl
                      );
          }
          if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_parent.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_parent.vin);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&package_3gen);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&package_parent_child);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::~_Rb_tree(&result_unrelated_submit.m_tx_results._M_t);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_debug_message._M_dataplus._M_p !=
              &result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_debug_message.field_2) {
            operator_delete(result_unrelated_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_debug_message.
                            _M_dataplus._M_p,
                            result_unrelated_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
                            _M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
                 m_reject_reason._M_dataplus._M_p !=
              &result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason.field_2) {
            operator_delete(result_unrelated_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_reject_reason.
                            _M_dataplus._M_p,
                            result_unrelated_submit.m_state.
                            super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
                            _M_allocated_capacity + 1);
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&package_unrelated);
          if (0x1c < local_7c) {
            free(local_98.indirect_contents.indirect);
          }
          if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               )local_3b0._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
              (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
            SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                      ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_3b0,
                       (array<unsigned_char,_32UL> *)
                       local_3b0._M_t.
                       super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl
                      );
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return;
          }
        }
      }
    }
  }
LAB_0068de03:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_submission_tests)
{
    LOCK(cs_main);
    unsigned int expected_pool_size = m_node.mempool->size();
    CKey parent_key = GenerateRandomKey();
    CScript parent_locking_script = GetScriptForDestination(PKHash(parent_key.GetPubKey()));

    // Unrelated transactions are not allowed in package submission.
    Package package_unrelated;
    for (size_t i{0}; i < 10; ++i) {
        auto mtx = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[i + 25], /*input_vout=*/0,
                                                 /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                 /*output_destination=*/parent_locking_script,
                                                 /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
        package_unrelated.emplace_back(MakeTransactionRef(mtx));
    }
    auto result_unrelated_submit = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                     package_unrelated, /*test_accept=*/false, /*client_maxfeerate=*/{});
    // We don't expect m_tx_results for each transaction when basic sanity checks haven't passed.
    BOOST_CHECK(result_unrelated_submit.m_state.IsInvalid());
    BOOST_CHECK_EQUAL(result_unrelated_submit.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(result_unrelated_submit.m_state.GetRejectReason(), "package-not-child-with-parents");
    BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

    // Parent and Child (and Grandchild) Package
    Package package_parent_child;
    Package package_3gen;
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_locking_script,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
    package_parent_child.push_back(tx_parent);
    package_3gen.push_back(tx_parent);

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(PKHash(child_key.GetPubKey()));
    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/parent_key,
                                                   /*output_destination=*/child_locking_script,
                                                   /*output_amount=*/CAmount(48 * COIN), /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    package_parent_child.push_back(tx_child);
    package_3gen.push_back(tx_child);

    CKey grandchild_key = GenerateRandomKey();
    CScript grandchild_locking_script = GetScriptForDestination(PKHash(grandchild_key.GetPubKey()));
    auto mtx_grandchild = CreateValidMempoolTransaction(/*input_transaction=*/tx_child, /*input_vout=*/0,
                                                       /*input_height=*/101, /*input_signing_key=*/child_key,
                                                       /*output_destination=*/grandchild_locking_script,
                                                       /*output_amount=*/CAmount(47 * COIN), /*submit=*/false);
    CTransactionRef tx_grandchild = MakeTransactionRef(mtx_grandchild);
    package_3gen.push_back(tx_grandchild);

    // 3 Generations is not allowed.
    {
        auto result_3gen_submit = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                    package_3gen, /*test_accept=*/false, /*client_maxfeerate=*/{});
        BOOST_CHECK(result_3gen_submit.m_state.IsInvalid());
        BOOST_CHECK_EQUAL(result_3gen_submit.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(result_3gen_submit.m_state.GetRejectReason(), "package-not-child-with-parents");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Parent and child package where transactions are invalid for reasons other than fee and
    // missing inputs, so the package validation isn't expected to happen.
    {
        CScriptWitness bad_witness;
        bad_witness.stack.emplace_back(1);
        CMutableTransaction mtx_parent_invalid{mtx_parent};
        mtx_parent_invalid.vin[0].scriptWitness = bad_witness;
        CTransactionRef tx_parent_invalid = MakeTransactionRef(mtx_parent_invalid);
        Package package_invalid_parent{tx_parent_invalid, tx_child};
        auto result_quit_early = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_invalid_parent, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_parent_invalid{CheckPackageMempoolAcceptResult(package_invalid_parent, result_quit_early, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_parent_invalid.value());
        } else {
            auto it_parent = result_quit_early.m_tx_results.find(tx_parent_invalid->GetWitnessHash());
            auto it_child = result_quit_early.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK_EQUAL(it_parent->second.m_state.GetResult(), TxValidationResult::TX_WITNESS_MUTATED);
            BOOST_CHECK_EQUAL(it_parent->second.m_state.GetRejectReason(), "bad-witness-nonstandard");
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetResult(), TxValidationResult::TX_MISSING_INPUTS);
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetRejectReason(), "bad-txns-inputs-missingorspent");
        }
        BOOST_CHECK_EQUAL(result_quit_early.m_state.GetResult(), PackageValidationResult::PCKG_TX);
    }

    // Child with missing parent.
    mtx_child.vin.emplace_back(COutPoint(package_unrelated[0]->GetHash(), 0));
    Package package_missing_parent;
    package_missing_parent.push_back(tx_parent);
    package_missing_parent.push_back(MakeTransactionRef(mtx_child));
    {
        const auto result_missing_parent = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                             package_missing_parent, /*test_accept=*/false, /*client_maxfeerate=*/{});
        BOOST_CHECK(result_missing_parent.m_state.IsInvalid());
        BOOST_CHECK_EQUAL(result_missing_parent.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(result_missing_parent.m_state.GetRejectReason(), "package-not-child-with-unconfirmed-parents");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Submit package with parent + child.
    {
        const auto submit_parent_child = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                           package_parent_child, /*test_accept=*/false, /*client_maxfeerate=*/{});
        expected_pool_size += 2;
        BOOST_CHECK_MESSAGE(submit_parent_child.m_state.IsValid(),
                            "Package validation unexpectedly failed: " << submit_parent_child.m_state.GetRejectReason());
        BOOST_CHECK_EQUAL(submit_parent_child.m_tx_results.size(), package_parent_child.size());
        auto it_parent = submit_parent_child.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child = submit_parent_child.m_tx_results.find(tx_child->GetWitnessHash());
        BOOST_CHECK(it_parent != submit_parent_child.m_tx_results.end());
        BOOST_CHECK(it_parent->second.m_state.IsValid());
        BOOST_CHECK(it_parent->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_parent)));
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().front(), tx_parent->GetWitnessHash());
        BOOST_CHECK(it_child->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_child)));
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().front(), tx_child->GetWitnessHash());

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Already-in-mempool transactions should be detected and de-duplicated.
    {
        const auto submit_deduped = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                      package_parent_child, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_deduped{CheckPackageMempoolAcceptResult(package_parent_child, submit_deduped, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_deduped.value());
        } else {
            auto it_parent_deduped = submit_deduped.m_tx_results.find(tx_parent->GetWitnessHash());
            auto it_child_deduped = submit_deduped.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK(it_parent_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        }

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }
}